

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubModel.cpp
# Opt level: O3

void iDynTree::computeTransformToTraversalBase
               (Model *fullModel,Traversal *subModelTraversal,JointPosDoubleArray *jointPos,
               LinkPositions *traversalBase_H_link)

{
  uint uVar1;
  Link *this;
  Link *this_00;
  IJoint *pIVar2;
  LinkIndex LVar3;
  Transform *pTVar4;
  LinkIndex LVar5;
  ulong traversalIndex;
  Transform local_90 [96];
  
  uVar1 = Traversal::getNrOfVisitedLinks(subModelTraversal);
  if (uVar1 != 0) {
    traversalIndex = 0;
    do {
      this = Traversal::getLink(subModelTraversal,traversalIndex);
      this_00 = Traversal::getParentLink(subModelTraversal,traversalIndex);
      pIVar2 = Traversal::getParentJoint(subModelTraversal,traversalIndex);
      if (this_00 == (Link *)0x0) {
        iDynTree::Transform::Identity();
        LVar3 = Link::getIndex(this);
      }
      else {
        LVar3 = Link::getIndex(this_00);
        pTVar4 = LinkPositions::operator()(traversalBase_H_link,LVar3);
        LVar3 = Link::getIndex(this_00);
        LVar5 = Link::getIndex(this);
        (*pIVar2->_vptr_IJoint[10])(pIVar2,jointPos,LVar3,LVar5);
        iDynTree::Transform::operator*(local_90,pTVar4);
        LVar3 = Link::getIndex(this);
      }
      pTVar4 = LinkPositions::operator()(traversalBase_H_link,LVar3);
      iDynTree::Transform::operator=(pTVar4,local_90);
      traversalIndex = traversalIndex + 1;
      uVar1 = Traversal::getNrOfVisitedLinks(subModelTraversal);
    } while (traversalIndex < uVar1);
  }
  return;
}

Assistant:

void computeTransformToTraversalBase(const Model& fullModel,
                                     const Traversal& subModelTraversal,
                                     const JointPosDoubleArray& jointPos,
                                           LinkPositions& traversalBase_H_link)
{
    for(unsigned int traversalEl=0; traversalEl < subModelTraversal.getNrOfVisitedLinks(); traversalEl++)
    {
        LinkConstPtr visitedLink = subModelTraversal.getLink(traversalEl);
        LinkConstPtr parentLink  = subModelTraversal.getParentLink(traversalEl);
        IJointConstPtr toParentJoint = subModelTraversal.getParentJoint(traversalEl);

        // If this is the traversal base
        if( parentLink == 0 )
        {
            // If the visited link is the base, the base has no parent.
            // In this case the position of the base with respect to the base is simply
            // an identity transform
            traversalBase_H_link(visitedLink->getIndex()) = iDynTree::Transform::Identity();
        }
        else
        {
            // Otherwise we compute the world_H_link transform as:
            // world_H_link = world_H_parentLink * parentLink_H_link
            traversalBase_H_link(visitedLink->getIndex()) =
                traversalBase_H_link(parentLink->getIndex())*
                    toParentJoint->getTransform(jointPos,parentLink->getIndex(),visitedLink->getIndex());
        }
    }

    return;
}